

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

LogicProgram * __thiscall Clasp::Asp::LogicProgram::addProject(LogicProgram *this,AtomSpan *atoms)

{
  bool bVar1;
  reference puVar2;
  iterator last;
  uint *first;
  Span<unsigned_int> *in_RSI;
  LogicProgram *in_RDI;
  VarVec *pro;
  VarVec *this_00;
  uint *in_stack_ffffffffffffffc8;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar1 = ProgramBuilder::frozen(&in_RDI->super_ProgramBuilder);
  if (bVar1) {
    Potassco::fail(-2,
                   "LogicProgram &Clasp::Asp::LogicProgram::addProject(const Potassco::AtomSpan &)",
                   0x28b,"!frozen()","Can\'t update frozen program!",0);
  }
  this_00 = &in_RDI->auxData_->project;
  bVar1 = Potassco::empty<unsigned_int>(in_RSI);
  if (bVar1) {
    bVar1 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(this_00);
    if (bVar1) {
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  else {
    bVar1 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(this_00);
    if ((!bVar1) &&
       (puVar2 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::back(this_00),
       *puVar2 == 0)) {
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(this_00);
    }
    last = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    first = Potassco::begin<unsigned_int>(in_RSI);
    Potassco::end<unsigned_int>((Span<unsigned_int> *)0x17b908);
    bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*>
              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(iterator)in_RDI,first,
               last,(type_conflict *)this_00);
  }
  return in_RDI;
}

Assistant:

LogicProgram& LogicProgram::addProject(const Potassco::AtomSpan& atoms) {
	check_not_frozen();
	VarVec& pro = auxData_->project;
	if (!Potassco::empty(atoms)) {
		if (!pro.empty() && pro.back() == 0) { pro.pop_back(); }
		pro.insert(pro.end(), Potassco::begin(atoms), Potassco::end(atoms));
	}
	else if (pro.empty()) {
		pro.push_back(0);
	}
	return *this;
}